

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O3

DecInfo * __thiscall PriorityBranchGroup::branch(PriorityBranchGroup *this)

{
  Tint *pTVar1;
  vec<int> *pvVar2;
  VarBranch VVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined4 extraout_var;
  Branching **ppBVar7;
  undefined4 extraout_var_00;
  Branching *pBVar8;
  int *pt;
  ulong uVar9;
  double extraout_XMM0_Qa;
  uniform_int_distribution<int> rnd_move_1;
  uniform_int_distribution<int> rnd_move;
  double local_50;
  TrailElem local_48;
  uniform_int_distribution<int> local_38;
  
  lVar6 = (long)(this->super_BranchGroup).cur.v;
  if ((-1 < lVar6) &&
     (iVar4 = (**(this->annotations).data[lVar6]->_vptr_Branching)(), (char)iVar4 == '\0')) {
    iVar4 = (*(this->annotations).data[(uint)(this->super_BranchGroup).cur.v]->_vptr_Branching[2])()
    ;
    return (DecInfo *)CONCAT44(extraout_var,iVar4);
  }
  pTVar1 = &(this->super_BranchGroup).cur;
  VVar3 = (this->super_BranchGroup).var_branch;
  if (VVar3 == VAR_RANDOM) {
    pvVar2 = &(this->super_BranchGroup).moves;
    if ((this->super_BranchGroup).moves.data != (int *)0x0) {
      pvVar2->sz = 0;
    }
    if ((this->annotations).sz != 0) {
      uVar9 = 0;
      do {
        iVar4 = (**(this->annotations).data[uVar9]->_vptr_Branching)();
        if ((char)iVar4 == '\0') {
          local_48.pt = (int *)CONCAT44(local_48.pt._4_4_,(int)uVar9);
          vec<int>::push(pvVar2,(int *)&local_48);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (this->annotations).sz);
    }
    if (pvVar2->sz == 0) {
      return (DecInfo *)0x0;
    }
    local_38._M_param._M_b = pvVar2->sz - 1;
    local_38._M_param._M_a = 0;
    uVar5 = std::uniform_int_distribution<int>::operator()(&local_38,&engine.rnd,&local_38._M_param)
    ;
    uVar5 = (this->super_BranchGroup).moves.data[uVar5];
    if ((this->super_BranchGroup).terminal == false) {
      local_48.x = pTVar1->v;
      local_48.sz = 4;
      local_48.pt = &pTVar1->v;
      vec<TrailElem>::push(&engine.trail,&local_48);
      pTVar1->v = uVar5;
    }
    pBVar8 = (this->annotations).data[uVar5];
  }
  else {
    if (VVar3 == VAR_INORDER) {
      if ((this->annotations).sz == 0) {
        return (DecInfo *)0x0;
      }
      uVar9 = 0;
      do {
        iVar4 = (**(this->annotations).data[uVar9]->_vptr_Branching)();
        uVar5 = (this->annotations).sz;
        if ((char)iVar4 == '\0') break;
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar5);
      if (uVar5 == (uint)uVar9) {
        return (DecInfo *)0x0;
      }
      if ((this->super_BranchGroup).terminal == false) {
        local_48.x = pTVar1->v;
        local_48.sz = 4;
        local_48.pt = &pTVar1->v;
        vec<TrailElem>::push(&engine.trail,&local_48);
        pTVar1->v = (uint)uVar9;
      }
      ppBVar7 = (this->annotations).data;
      uVar9 = uVar9 & 0xffffffff;
    }
    else {
      pvVar2 = &(this->super_BranchGroup).moves;
      if ((this->super_BranchGroup).moves.data != (int *)0x0) {
        pvVar2->sz = 0;
      }
      if ((this->annotations).sz != 0) {
        local_50 = -1e+100;
        uVar9 = 0;
        do {
          iVar4 = (**(this->annotations).data[uVar9]->_vptr_Branching)();
          if (((char)iVar4 == '\0') &&
             (pBVar8 = (this->super_BranchGroup).x.data[uVar9],
             (*pBVar8->_vptr_Branching[1])(pBVar8,(ulong)(this->super_BranchGroup).var_branch),
             local_50 <= extraout_XMM0_Qa)) {
            if ((local_50 < extraout_XMM0_Qa) &&
               (local_50 = extraout_XMM0_Qa, (this->super_BranchGroup).moves.data != (int *)0x0)) {
              pvVar2->sz = 0;
            }
            local_48.pt = (int *)CONCAT44(local_48.pt._4_4_,(int)uVar9);
            vec<int>::push(pvVar2,(int *)&local_48);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->annotations).sz);
      }
      if (pvVar2->sz == 0) {
        return (DecInfo *)0x0;
      }
      if (so.branch_random == true) {
        local_48.pt = (int *)((ulong)(pvVar2->sz - 1) << 0x20);
        uVar5 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_48,&engine.rnd,
                           (param_type *)&local_48);
        uVar5 = (this->super_BranchGroup).moves.data[uVar5];
      }
      else {
        uVar5 = *(this->super_BranchGroup).moves.data;
      }
      if ((this->super_BranchGroup).terminal == false) {
        local_48.x = pTVar1->v;
        local_48.sz = 4;
        local_48.pt = &pTVar1->v;
        vec<TrailElem>::push(&engine.trail,&local_48);
        pTVar1->v = uVar5;
      }
      ppBVar7 = (this->annotations).data;
      uVar9 = (ulong)uVar5;
    }
    pBVar8 = ppBVar7[uVar9];
  }
  iVar4 = (*pBVar8->_vptr_Branching[2])();
  return (DecInfo *)CONCAT44(extraout_var_00,iVar4);
}

Assistant:

DecInfo* PriorityBranchGroup::branch() {
	// Check whether the current branching group has finished,
	// if not yet then continue search with this one
	if (cur >= 0 && !annotations[cur]->finished()) {
		return annotations[cur]->branch();
	}

	/* Select the next branching group */

	// Special case of input order selection
	if (var_branch == VAR_INORDER) {
		unsigned int i = 0;
		while (i < annotations.size() && annotations[i]->finished()) {
			i++;
		}
		if (i == annotations.size()) {
			return nullptr;
		}
		if (!terminal) {
			cur = i;
		}
		return annotations[i]->branch();
	}
	// Special case of random order selection
	if (var_branch == VAR_RANDOM) {
		moves.clear();
		for (unsigned int i = 0; i < annotations.size(); i++) {
			if (!annotations[i]->finished()) {
				moves.push(i);
			}
		}
		if (moves.size() == 0) {
			return nullptr;
		}
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		const int best_i = moves[rnd_move(engine.rnd)];
		if (!terminal) {
			cur = best_i;
		}
		return annotations[best_i]->branch();
	}

	// All other selection strategies
	double best = -1e100;
	moves.clear();
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (annotations[i]->finished()) {
			continue;
		}
		const double s = x[i]->getScore(var_branch);
		if (s >= best) {
			if (s > best) {
				best = s;
				moves.clear();
			}
			moves.push(i);
		}
	}
	if (moves.size() == 0) {
		return nullptr;
	}
	int best_i = moves[0];
	// Special case of random selection of best moves
	if (so.branch_random) {
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		best_i = moves[rnd_move(engine.rnd)];
	}

	if (!terminal) {
		cur = best_i;
	}
	return annotations[best_i]->branch();
}